

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

NodeId __thiscall
optimization::common_expr_del::BlockNodes::add_leaf_node(BlockNodes *this,Value *val)

{
  pointer psVar1;
  pointer psVar2;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *__k;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  NodeId NVar5;
  shared_ptr<optimization::common_expr_del::Node> node;
  value_type local_30;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::make_shared<optimization::common_expr_del::Node>();
  std::optional<mir::inst::Value>::operator=
            (&(local_30.
               super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->value,val);
  NVar5.id = (uint32_t)((ulong)((long)psVar1 - (long)psVar2) >> 4);
  if (val->field_0x18 == '\x01') {
    __k = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&val->field_0x8);
    pmVar3 = std::
             map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
             ::operator[](&this->var_map,__k);
    pmVar3->id = NVar5.id;
  }
  std::
  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
  ::push_back(&this->nodes,&local_30);
  pmVar4 = std::
           map<optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
           ::operator[](&this->node_map,
                        local_30.
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
  pmVar4->id = NVar5.id;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.
              super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (NodeId)NVar5.id;
}

Assistant:

NodeId add_leaf_node(mir::inst::Value val) {
    auto id = nodes.size();
    NodeId nodeId(id);
    auto node = std::make_shared<Node>();
    node->value = val;
    if (val.index() == 1) {
      var_map[std::get<mir::inst::VarId>(val)] = nodeId;
    }
    nodes.push_back(node);
    node_map[*node] = id;
    return nodeId;
  }